

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_norm_wt_fullvar
               (vector_t ****in_var,vector_t ****wt_var,int32 pass2var,float32 ***dnom,
               vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
               int32 tiedvar)

{
  uint uVar1;
  vector_t pfVar2;
  float *pfVar3;
  float32 *pfVar4;
  ulong uVar5;
  ulong uVar6;
  float32 **a;
  ulong uVar7;
  vector_t pfVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  
  uVar12 = (ulong)n_feat;
  uVar5 = (ulong)n_mgau;
  if (tiedvar != 0) {
    for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
      uVar11 = 1;
      if (pass2var == 0) {
        uVar1 = veclen[uVar6];
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          (*(*mean)[uVar6])[uVar7] = (float)*(*dnom)[uVar6] * (*(*mean)[uVar6])[uVar7];
        }
      }
      for (; uVar11 < n_density; uVar11 = uVar11 + 1) {
        uVar1 = veclen[uVar6];
        for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
          pfVar8 = (*wt_var)[uVar6][uVar11][uVar7];
          pfVar2 = (*(*wt_var)[uVar6])[uVar7];
          for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
            pfVar2[uVar9] = pfVar8[uVar9] + pfVar2[uVar9];
          }
          if (pass2var == 0) {
            pfVar8 = *(*mean)[uVar6];
            pfVar8[uVar7] =
                 (*mean)[uVar6][uVar11][uVar7] * (float)(*dnom)[uVar6][uVar11] + pfVar8[uVar7];
          }
        }
        pfVar3 = (float *)(*dnom)[uVar6];
        *pfVar3 = pfVar3[uVar11] + *pfVar3;
      }
    }
    for (uVar6 = 1; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        for (uVar7 = 0; uVar7 != n_density; uVar7 = uVar7 + 1) {
          uVar1 = veclen[uVar11];
          for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
            pfVar8 = wt_var[uVar6][uVar11][uVar7][uVar9];
            pfVar2 = (*(*wt_var)[uVar11])[uVar9];
            for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
              pfVar2[uVar10] = pfVar8[uVar10] + pfVar2[uVar10];
            }
            if (pass2var == 0) {
              (*(*mean)[uVar11])[uVar9] =
                   mean[uVar6][uVar11][uVar7][uVar9] * (float)dnom[uVar6][uVar11][uVar7] +
                   (*(*mean)[uVar11])[uVar9];
            }
          }
          *(*dnom)[uVar11] = (float32)((float)dnom[uVar6][uVar11][uVar7] + (float)*(*dnom)[uVar11]);
        }
      }
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        for (uVar7 = 0; uVar7 != n_density; uVar7 = uVar7 + 1) {
          uVar1 = veclen[uVar11];
          for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
            if (pass2var == 0) {
              if ((int)uVar7 == 0 && (int)uVar6 == 0) {
                (*(*mean)[uVar11])[uVar9] = (*(*mean)[uVar11])[uVar9] / (float)*(*dnom)[uVar11];
              }
              else {
                mean[uVar6][uVar11][uVar7][uVar9] = (*(*mean)[uVar11])[uVar9];
              }
            }
            pfVar8 = (*(*wt_var)[uVar11])[uVar9];
            pfVar2 = wt_var[uVar6][uVar11][uVar7][uVar9];
            for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
              pfVar2[uVar10] = pfVar8[uVar10];
            }
          }
          dnom[uVar6][uVar11][uVar7] = *(*dnom)[uVar11];
        }
      }
    }
  }
  for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
    for (uVar6 = 0; uVar6 != n_feat; uVar6 = uVar6 + 1) {
      if (pass2var == 0) {
        a = (float32 **)
            __ckd_calloc_2d__((ulong)veclen[uVar6],(ulong)veclen[uVar6],4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                              ,0x703);
      }
      else {
        a = (float32 **)0x0;
      }
      for (uVar11 = 0; uVar11 != n_density; uVar11 = uVar11 + 1) {
        if (pass2var == 0) {
          outerproduct(a,(float32 *)mean[uVar12][uVar6][uVar11],
                       (float32 *)mean[uVar12][uVar6][uVar11],veclen[uVar6]);
        }
        pfVar4 = dnom[uVar12][uVar6];
        if (((float)pfVar4[uVar11] != 0.0) || (NAN((float)pfVar4[uVar11]))) {
          uVar1 = veclen[uVar6];
          for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
            for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
              if (pass2var == 0) {
                pfVar8 = wt_var[uVar12][uVar6][uVar11][uVar7];
                fVar13 = pfVar8[uVar9] / (float)pfVar4[uVar11] - (float)a[uVar7][uVar9];
              }
              else {
                pfVar8 = wt_var[uVar12][uVar6][uVar11][uVar7];
                fVar13 = pfVar8[uVar9] / (float)pfVar4[uVar11];
              }
              pfVar8[uVar9] = fVar13;
            }
          }
        }
        else if (in_var != (vector_t ****)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x71b,"Copying unseen var (%u, %u, %u) from in_var\n",uVar12 & 0xffffffff,
                  uVar6 & 0xffffffff,(int)uVar11);
          uVar1 = veclen[uVar6];
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            wt_var[uVar12][uVar6][uVar11][uVar7] = in_var[uVar12][uVar6][uVar11][uVar7];
          }
        }
      }
      if (pass2var == 0) {
        ckd_free_2d(a);
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_fullvar(vector_t ****in_var,
		       vector_t ****wt_var,
		       int32 pass2var,
		       float32 ***dnom,
		       vector_t ***mean,
		       uint32 n_mgau,
		       uint32 n_feat,
		       uint32 n_density,
		       const uint32 *veclen,
		       int32 tiedvar)
{
    uint32 i, j, k, l, ll;

    if (tiedvar) {
	gauden_tie_fullvars_dnoms(wt_var, pass2var, dnom, mean,
				  n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    vector_t *outermean = NULL;
	    if (!pass2var)
		outermean = (vector_t *)ckd_calloc_2d(veclen[j], veclen[j], sizeof(float32));
		
	    for (k = 0; k < n_density; k++) {
		if (!pass2var)
		    outerproduct(outermean,
				 mean[i][j][k], mean[i][j][k],
				 veclen[j]);
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			for (ll = 0; ll < veclen[j]; ll++) {
			    if (!pass2var) {
				wt_var[i][j][k][l][ll] =
				    (wt_var[i][j][k][l][ll] / dnom[i][j][k]) -
				    outermean[l][ll];
			    }
			    else {
				wt_var[i][j][k][l][ll] /= dnom[i][j][k];
			    }
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	    if (!pass2var)
		ckd_free_2d((void **)outermean);
	}
    }
}